

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_execSequenceEnd
                 (BYTE *op,BYTE *oend,seq_t sequence,BYTE **litPtr,BYTE *litLimit,BYTE *prefixStart,
                 BYTE *virtualStart,BYTE *dictEnd)

{
  BYTE *pBVar1;
  size_t __n;
  size_t length1;
  BYTE *oend_w;
  BYTE *match;
  BYTE *iLitEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  BYTE *virtualStart_local;
  BYTE *prefixStart_local;
  BYTE *litLimit_local;
  BYTE **litPtr_local;
  BYTE *oend_local;
  BYTE *op_local;
  
  oend_local = op + sequence.litLength;
  op_local = (BYTE *)(sequence.litLength + sequence.matchLength);
  pBVar1 = *litPtr;
  oend_w = oend_local + -sequence.offset;
  if (oend + -(long)op < op_local) {
    op_local = (BYTE *)0xffffffffffffffba;
  }
  else if ((ulong)((long)litLimit - (long)*litPtr) < sequence.litLength) {
    op_local = (BYTE *)0xffffffffffffffec;
  }
  else {
    if (op + (long)op_local <= op) {
      __assert_fail("op < op + sequenceLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x376,
                    "size_t ZSTD_execSequenceEnd(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (op + (long)op_local <= oend_local) {
      __assert_fail("oLitEnd < op + sequenceLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x377,
                    "size_t ZSTD_execSequenceEnd(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    ZSTD_safecopy(op,oend + -0x20,*litPtr,sequence.litLength,ZSTD_no_overlap);
    *litPtr = pBVar1 + sequence.litLength;
    if ((ulong)((long)oend_local - (long)prefixStart) < sequence.offset) {
      if ((ulong)((long)oend_local - (long)virtualStart) < sequence.offset) {
        return 0xffffffffffffffec;
      }
      pBVar1 = dictEnd + -((long)prefixStart - (long)oend_w);
      if (pBVar1 + sequence.matchLength <= dictEnd) {
        memmove(oend_local,pBVar1,sequence.matchLength);
        return (size_t)op_local;
      }
      __n = (long)dictEnd - (long)pBVar1;
      memmove(oend_local,pBVar1,__n);
      oend_local = oend_local + __n;
      sequence.matchLength = sequence.matchLength - __n;
      oend_w = prefixStart;
    }
    ZSTD_safecopy(oend_local,oend + -0x20,oend_w,sequence.matchLength,ZSTD_overlap_src_before_dst);
  }
  return (size_t)op_local;
}

Assistant:

FORCE_NOINLINE
size_t ZSTD_execSequenceEnd(BYTE* op,
    BYTE* const oend, seq_t sequence,
    const BYTE** litPtr, const BYTE* const litLimit,
    const BYTE* const prefixStart, const BYTE* const virtualStart, const BYTE* const dictEnd)
{
    BYTE* const oLitEnd = op + sequence.litLength;
    size_t const sequenceLength = sequence.litLength + sequence.matchLength;
    const BYTE* const iLitEnd = *litPtr + sequence.litLength;
    const BYTE* match = oLitEnd - sequence.offset;
    BYTE* const oend_w = oend - WILDCOPY_OVERLENGTH;

    /* bounds checks : careful of address space overflow in 32-bit mode */
    RETURN_ERROR_IF(sequenceLength > (size_t)(oend - op), dstSize_tooSmall, "last match must fit within dstBuffer");
    RETURN_ERROR_IF(sequence.litLength > (size_t)(litLimit - *litPtr), corruption_detected, "try to read beyond literal buffer");
    assert(op < op + sequenceLength);
    assert(oLitEnd < op + sequenceLength);

    /* copy literals */
    ZSTD_safecopy(op, oend_w, *litPtr, sequence.litLength, ZSTD_no_overlap);
    op = oLitEnd;
    *litPtr = iLitEnd;

    /* copy Match */
    if (sequence.offset > (size_t)(oLitEnd - prefixStart)) {
        /* offset beyond prefix */
        RETURN_ERROR_IF(sequence.offset > (size_t)(oLitEnd - virtualStart), corruption_detected, "");
        match = dictEnd - (prefixStart - match);
        if (match + sequence.matchLength <= dictEnd) {
            ZSTD_memmove(oLitEnd, match, sequence.matchLength);
            return sequenceLength;
        }
        /* span extDict & currentPrefixSegment */
        {   size_t const length1 = dictEnd - match;
        ZSTD_memmove(oLitEnd, match, length1);
        op = oLitEnd + length1;
        sequence.matchLength -= length1;
        match = prefixStart;
        }
    }
    ZSTD_safecopy(op, oend_w, match, sequence.matchLength, ZSTD_overlap_src_before_dst);
    return sequenceLength;
}